

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execBitFieldEa<(moira::Core)2,(moira::Instr)140,(moira::Mode)7,4>
          (Moira *this,u16 opcode)

{
  bool *pbVar1;
  ushort uVar2;
  sbyte sVar3;
  u32 addr;
  u32 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  this->cp = 0;
  uVar2 = (this->queue).irc;
  uVar5 = (uint)uVar2;
  uVar4 = (this->reg).pc + 2;
  (this->reg).pc = uVar4;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar4);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  if ((uVar2 >> 0xb & 1) == 0) {
    uVar7 = uVar2 >> 6 & 0x1f;
  }
  else {
    uVar7 = *(uint *)((long)&(this->reg).field_3 + (ulong)(uVar2 >> 6 & 7) * 4);
  }
  if ((uVar2 & 0x20) != 0) {
    uVar5 = *(uint *)((long)&(this->reg).field_3 + (ulong)(uVar5 & 7) * 4);
  }
  uVar9 = uVar5 - 1 & 0x1f;
  uVar4 = computeEA<(moira::Core)2,(moira::Mode)7,4,0ull>(this,opcode & 7);
  uVar5 = uVar7 + 7;
  if (-1 < (int)uVar7) {
    uVar5 = uVar7;
  }
  uVar8 = (int)uVar7 % 8 & 7;
  sVar3 = (sbyte)uVar8;
  uVar6 = (ulong)(-0x100000000 << ((byte)uVar9 ^ 0x1f)) >> sVar3;
  addr = ((int)uVar5 >> 3) + uVar4 + ((int)uVar7 % 8 >> 0x1f);
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)1,4,0ull>(this,addr);
  uVar5 = (uint)(uVar6 >> 0x20);
  (this->reg).sr.n = SUB41((uVar4 << sVar3) >> 0x1f,0);
  (this->reg).sr.z = (uVar4 & uVar5) == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  write<(moira::Core)2,(moira::AddrSpace)1,4,0ull>(this,addr,uVar4 | uVar5);
  if (0x20 < uVar8 + uVar9 + 1) {
    uVar5 = (uint)(uVar6 >> 0x18) & 0xff;
    uVar4 = read<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,addr + 4);
    write<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,addr + 4,uVar4 | uVar5);
    pbVar1 = &(this->reg).sr.z;
    *pbVar1 = (bool)(*pbVar1 & (uVar4 & uVar5) == 0);
  }
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x18));
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  return;
}

Assistant:

void
Moira::execBitFieldEa(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u16 ext = (u16)readI<C, Word>();

    int dy     = _____________xxx (opcode);
    int dn     = _xxx____________ (ext);
    int offset = _____xxxxx______ (ext);
    int doBit  = ____x___________ (ext);
    int width  = ___________xxxxx (ext);
    int dwBit  = __________x_____ (ext);

    // If Do or Dw is set, offset or width are taken from data registers
    if (doBit) offset = reg.d[offset & 0b111];
    if (dwBit) width = reg.d[width & 0b111];

    // Map width to 32, 1 ... 31
    width = ((width - 1) & 0b11111) + 1;

    u32 oldOffset = offset;
    u32 result, insert;

    // Compute the effective address
    u32 ea = computeEA<C, M, S>(dy);

    ea += offset / 8;
    offset %= 8;
    if(offset < 0) {

        offset += 8;
        ea--;
    }

    // Create bit masks
    u64 baseMask = (0xFFFFFFFF00000000 << (32 - width)) >> offset;
    auto mask = u32(baseMask >> 32);
    auto mask8 = u8(baseMask >> 24);

    u32 data = readM<C, M, S>(ea);

    switch (I) {

        case Instr::BFCHG:
        case Instr::BFCLR:
        case Instr::BFSET:

            result = bitfield<I>(data, offset, width, mask);
            writeM<C, M, S>(ea, result);

            if((width + offset) > 32) {

                data = readM<C, M, Byte>(ea + 4);

                if constexpr (I == Instr::BFCHG) writeM<C, M, Byte>(ea + 4, data ^ mask8);
                if constexpr (I == Instr::BFCLR) writeM<C, M, Byte>(ea + 4, data & ~mask8);
                if constexpr (I == Instr::BFSET) writeM<C, M, Byte>(ea + 4, data | mask8);

                reg.sr.z &= ZERO<Byte>(data & mask8);
            }

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 24)
            CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 25)
            CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 27)
            CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 24)
            CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 24)
            break;

        case Instr::BFEXTS:
        case Instr::BFEXTU:

            data = CLIP<Long>(data << offset);

            if((offset + width) > 32) {
                data |= (readM<C, M, Byte>(ea + 4) << offset) >> 8;
            }

            result = bitfield<I>(data, offset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 19)
            CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 20)
            CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 22)
            CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 19)
            CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 19)
            CYCLES_DIPC ( 0,  0,  0,        0,  0,  0,        0,  0, 20)
            CYCLES_IXPC ( 0,  0,  0,        0,  0,  0,        0,  0, 22)
            break;

        case Instr::BFFFO:

            data = CLIP<Long>(data << offset);

            if((offset + width) > 32) {

                data |= (readM<C, M, Byte>(ea + 4) << offset) >> 8;
            }

            result = bitfield<I>(data, oldOffset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 32)
            CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 33)
            CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 35)
            CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 32)
            CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 32)
            CYCLES_DIPC ( 0,  0,  0,        0,  0,  0,        0,  0, 33)
            CYCLES_IXPC ( 0,  0,  0,        0,  0,  0,        0,  0, 35)
            break;

        case Instr::BFINS:
        {
            insert = readD(dn);
            insert = u32(insert << (32 - width));

            reg.sr.n = NBIT<S>(insert);
            reg.sr.z = ZERO<S>(insert);
            reg.sr.v = 0;
            reg.sr.c = 0;

            writeM<C, M, S>(ea, (data & ~mask) | insert >> offset);

            if((width + offset) > 32) {

                data = readM<C, M, Byte>(ea + 4);
                u8 insert8 = u8(readD(dn) << (8 - ((width + offset) - 32)));
                writeM<C, M, Byte>(ea + 4, (data & ~mask8) | insert8);
                reg.sr.z &= ZERO<Byte>(insert8);
            }

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 21)
            CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 22)
            CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 24)
            CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 21)
            CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 21)
            break;
        }
        case Instr::BFTST:

            (void)bitfield<I>(data, offset, width, mask);

            if((width + offset) > 32) {

                u8 data2 = u8(readM<C, M, Byte>(ea + 4));
                reg.sr.z &= ZERO<Byte>(data2 & mask8);
            }

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 17)
            CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 18)
            CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 20)
            CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 17)
            CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 17)
            CYCLES_DIPC ( 0,  0,  0,        0,  0,  0,        0,  0, 18)
            CYCLES_IXPC ( 0,  0,  0,        0,  0,  0,        0,  0, 20)
            break;

        default:
            fatalError;
    }

    prefetch<C, POLL>();

    FINALIZE
}